

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::SetPendingDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,PendingOperationalDataset *aDataset)

{
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetPendingDataset(const PendingOperationalDataset &aDataset)
{
    UNUSED(aDataset);
    return Error{};
}